

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall Assimp::FBXExporter::WriteDocuments(FBXExporter *this)

{
  long value;
  allocator<char> local_1f4;
  allocator<char> local_1f3;
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  string local_1a0;
  string local_180;
  Node doc;
  Node p;
  Node docs;
  
  if (this->binary == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&docs,"Documents Description",(allocator<char> *)&doc);
    WriteAsciiSectionHeader(this,&docs.name);
    std::__cxx11::string::~string((string *)&docs);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&doc,"Documents",(allocator<char> *)&p);
  FBX::Node::Node(&docs,&doc.name);
  std::__cxx11::string::~string((string *)&doc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&doc,"Count",(allocator<char> *)&p);
  FBX::Node::AddChild<int>(&docs,&doc.name,1);
  std::__cxx11::string::~string((string *)&doc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,"Document",(allocator<char> *)&local_1f0);
  FBX::Node::Node(&doc,&p.name);
  std::__cxx11::string::~string((string *)&p);
  value = this->last_uid + 1;
  this->last_uid = value;
  FBX::Node::AddProperties<long,char_const*,char_const*>(&doc,value,"","Scene");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Properties70",(allocator<char> *)&local_1d0);
  FBX::Node::Node(&p,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"SourceObject",&local_1f1)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"object",&local_1f2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"",&local_1f3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"",&local_1f4);
  FBX::Node::AddP70<>(&p,&local_1f0,&local_1d0,&local_180,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"ActiveAnimStackName",(allocator<char> *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"",(allocator<char> *)&local_1a0);
  FBX::Node::AddP70string(&p,&local_1f0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back(&doc.children,&p);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"RootNode",(allocator<char> *)&local_1d0);
  FBX::Node::AddChild<long>(&doc,&local_1f0,0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back(&docs.children,&doc)
  ;
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1b0,
             &(this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  FBX::Node::Dump(&docs,(shared_ptr<Assimp::IOStream> *)&local_1b0,this->binary,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
  FBX::Node::~Node(&p);
  FBX::Node::~Node(&doc);
  FBX::Node::~Node(&docs);
  return;
}

Assistant:

void FBXExporter::WriteDocuments ()
{
    if (!binary) {
        WriteAsciiSectionHeader("Documents Description");
    }
    
    // not sure what the use of multiple documents would be,
    // or whether any end-application supports it
    FBX::Node docs("Documents");
    docs.AddChild("Count", int32_t(1));
    FBX::Node doc("Document");

    // generate uid
    int64_t uid = generate_uid();
    doc.AddProperties(uid, "", "Scene");
    FBX::Node p("Properties70");
    p.AddP70("SourceObject", "object", "", ""); // what is this even for?
    p.AddP70string("ActiveAnimStackName", ""); // should do this properly?
    doc.AddChild(p);

    // UID for root node in scene hierarchy.
    // always set to 0 in the case of a single document.
    // not sure what happens if more than one document exists,
    // but that won't matter to us as we're exporting a single scene.
    doc.AddChild("RootNode", int64_t(0));

    docs.AddChild(doc);
    docs.Dump(outfile, binary, 0);
}